

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

bool __thiscall
duckdb::DictionaryCompressionCompressState::LookupString
          (DictionaryCompressionCompressState *this,string_t str)

{
  iterator iVar1;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18.pointer.ptr = (char *)str.value._8_8_;
  local_18._0_8_ = str.value._0_8_;
  iVar1 = ::std::
          _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_int>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_int>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->current_string_map)._M_h,(key_type *)&local_18.pointer);
  if (iVar1.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_int>,_true>._M_cur
      != (__node_type *)0x0) {
    this->latest_lookup_result =
         *(uint32_t *)
          ((long)iVar1.
                 super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_int>,_true>.
                 _M_cur + 0x18);
  }
  return iVar1.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_int>,_true>.
         _M_cur != (__node_type *)0x0;
}

Assistant:

bool DictionaryCompressionCompressState::LookupString(string_t str) {
	auto search = current_string_map.find(str);
	auto has_result = search != current_string_map.end();

	if (has_result) {
		latest_lookup_result = search->second;
	}
	return has_result;
}